

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::setModel(QTreeView *this,QAbstractItemModel *model)

{
  long lVar1;
  bool bVar2;
  QTreeViewPrivate *pQVar3;
  QAbstractItemModel *pQVar4;
  iterator pvVar5;
  QAbstractItemModel *in_RSI;
  long in_FS_OFFSET;
  QAbstractItemModel *in_stack_00000048;
  QAbstractItemView *in_stack_00000050;
  Connection *connection;
  iterator __end2;
  iterator __begin2;
  array<QMetaObject::Connection,_2UL> *__range2;
  QTreeViewPrivate *d;
  code *in_stack_fffffffffffffee8;
  QTreeViewPrivate *in_stack_fffffffffffffef0;
  Object *in_stack_fffffffffffffef8;
  array<QMetaObject::Connection,_2UL> *in_stack_ffffffffffffff00;
  QAbstractItemModel *in_stack_ffffffffffffff20;
  offset_in_QTreeView_to_subr *in_stack_ffffffffffffff30;
  ContextType *in_stack_ffffffffffffff38;
  ConnectionType type;
  Object *receiverPrivate;
  Object *sender;
  code *signal;
  Function slot;
  code *signal_00;
  Connection *local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTreeView *)0x8ee68e);
  if (in_RSI != (pQVar3->super_QAbstractItemViewPrivate).model) {
    if ((pQVar3->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) {
      in_stack_ffffffffffffff20 = (pQVar3->super_QAbstractItemViewPrivate).model;
      pQVar4 = (QAbstractItemModel *)QAbstractItemModelPrivate::staticEmptyModel();
      if (in_stack_ffffffffffffff20 != pQVar4) {
        local_60 = std::array<QMetaObject::Connection,_2UL>::begin
                             ((array<QMetaObject::Connection,_2UL> *)0x8ee729);
        pvVar5 = std::array<QMetaObject::Connection,_2UL>::end
                           ((array<QMetaObject::Connection,_2UL> *)0x8ee73e);
        for (; local_60 != pvVar5; local_60 = local_60 + 1) {
          QObject::disconnect(local_60);
        }
      }
    }
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8ee7b3);
    if (bVar2) {
      QObject::disconnect(&pQVar3->selectionmodelConnection);
    }
    QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)in_stack_fffffffffffffef0);
    QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8ee7f5);
    QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8ee809);
    pQVar3->geometryRecursionBlock = true;
    (**(code **)(*(long *)&(pQVar3->header->super_QAbstractItemView).super_QAbstractScrollArea.
                           super_QFrame.super_QWidget + 0x1c8))(pQVar3->header,in_RSI);
    pQVar3->geometryRecursionBlock = false;
    QAbstractItemView::setModel(in_stack_00000050,in_stack_00000048);
    if ((pQVar3->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) {
      signal_00 = QAbstractItemModel::rowsRemoved;
      slot = 0xc1;
      QObjectPrivate::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemViewPrivate::*)(QModelIndex_const&,int,int)>
                (in_stack_fffffffffffffef8,
                 (offset_in_QAbstractItemModel_to_subr)in_stack_ffffffffffffff30,
                 &in_stack_fffffffffffffef0->super_QAbstractItemViewPrivate,
                 (offset_in_QAbstractItemViewPrivate_to_subr)in_stack_ffffffffffffff20);
      QHeaderView::d_func((QHeaderView *)0x8ee8fb);
      signal = QAbstractItemModel::layoutChanged;
      sender = (Object *)0xf1;
      QObjectPrivate::
      disconnect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QAbstractItemViewPrivate::*)()>
                (in_stack_fffffffffffffef8,
                 (offset_in_QAbstractItemModel_to_subr)in_stack_ffffffffffffff30,
                 &in_stack_fffffffffffffef0->super_QAbstractItemViewPrivate,
                 (offset_in_QAbstractItemViewPrivate_to_subr)in_stack_ffffffffffffff20);
      type = AutoConnection;
      receiverPrivate = (Object *)0x0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QTreeView::*)(QModelIndex_const&,int,int)>
                ((Object *)QAbstractItemModel::rowsRemoved,
                 (offset_in_QAbstractItemModel_to_subr)signal,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,(ConnectionType)signal_00);
      in_stack_fffffffffffffee8 = QTreeViewPrivate::modelAboutToBeReset;
      in_stack_fffffffffffffef0 = (QTreeViewPrivate *)0x0;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QTreeViewPrivate::*)()>
                (sender,(offset_in_QAbstractItemModel_to_subr)signal_00,receiverPrivate,slot,type);
      std::array<QMetaObject::Connection,_2UL>::operator=
                (in_stack_ffffffffffffff00,
                 (array<QMetaObject::Connection,_2UL> *)in_stack_fffffffffffffef8);
      std::array<QMetaObject::Connection,_2UL>::~array(in_stack_ffffffffffffff00);
    }
    if ((pQVar3->sortingEnabled & 1U) != 0) {
      header((QTreeView *)in_stack_fffffffffffffef0);
      QHeaderView::sortIndicatorSection((QHeaderView *)in_stack_fffffffffffffef0);
      header((QTreeView *)in_stack_fffffffffffffef0);
      QHeaderView::sortIndicatorOrder((QHeaderView *)in_stack_fffffffffffffef0);
      QTreeViewPrivate::sortIndicatorChanged
                (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (SortOrder)in_stack_fffffffffffffee8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setModel(QAbstractItemModel *model)
{
    Q_D(QTreeView);
    if (model == d->model)
        return;
    if (d->model && d->model != QAbstractItemModelPrivate::staticEmptyModel()) {
        for (const QMetaObject::Connection &connection : d->modelConnections)
            QObject::disconnect(connection);
    }

    if (d->selectionModel) { // support row editing
        QObject::disconnect(d->selectionmodelConnection);
    }
    d->viewItems.clear();
    d->expandedIndexes.clear();
    d->hiddenIndexes.clear();
    d->geometryRecursionBlock = true;   // do not update geometries due to signals from the headers
    d->header->setModel(model);
    d->geometryRecursionBlock = false;
    QAbstractItemView::setModel(model);

    if (d->model) {
        // QAbstractItemView connects to a private slot
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::rowsRemoved,
                                   d, &QAbstractItemViewPrivate::rowsRemoved);
        // do header layout after the tree
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::layoutChanged,
                                   d->header->d_func(), &QAbstractItemViewPrivate::layoutChanged);

        d->modelConnections = {
            // QTreeView has a public slot for this
            QObject::connect(d->model, &QAbstractItemModel::rowsRemoved,
                             this, &QTreeView::rowsRemoved),
            QObjectPrivate::connect(d->model, &QAbstractItemModel::modelAboutToBeReset,
                                    d, &QTreeViewPrivate::modelAboutToBeReset)
        };
    }
    if (d->sortingEnabled)
        d->sortIndicatorChanged(header()->sortIndicatorSection(), header()->sortIndicatorOrder());
}